

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

PositionalBase * __thiscall args::Group::GetNextPositional(Group *this)

{
  Base *pBVar1;
  bool bVar2;
  Group *this_00;
  reference ppBVar3;
  long in_RDI;
  Group *group;
  PositionalBase *next;
  Base *child;
  iterator __end2;
  iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *in_stack_ffffffffffffff98;
  __normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  *in_stack_ffffffffffffffa0;
  PositionalBase *local_50;
  PositionalBase *local_38;
  __normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  local_20;
  
  this_00 = (Group *)(in_RDI + 0x30);
  local_20._M_current =
       (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin
                          (in_stack_ffffffffffffff98);
  std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar2) {
      return (PositionalBase *)0x0;
    }
    ppBVar3 = __gnu_cxx::
              __normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
              ::operator*(&local_20);
    pBVar1 = *ppBVar3;
    if (pBVar1 == (Base *)0x0) {
      local_50 = (PositionalBase *)0x0;
    }
    else {
      local_50 = (PositionalBase *)
                 __dynamic_cast(pBVar1,&Base::typeinfo,&PositionalBase::typeinfo,0);
    }
    local_38 = local_50;
    if (pBVar1 == (Base *)0x0) {
      in_stack_ffffffffffffffa0 =
           (__normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
            *)0x0;
    }
    else {
      in_stack_ffffffffffffffa0 =
           (__normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
            *)__dynamic_cast(pBVar1,&Base::typeinfo,&typeinfo,0);
    }
    if (in_stack_ffffffffffffffa0 !=
        (__normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
         *)0x0) {
      local_38 = GetNextPositional(this_00);
    }
    if ((local_38 != (PositionalBase *)0x0) && (bVar2 = PositionalBase::Ready(local_38), bVar2))
    break;
    __gnu_cxx::
    __normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>::
    operator++(&local_20);
  }
  return local_38;
}

Assistant:

PositionalBase *GetNextPositional()
            {
                for (Base *child: children)
                {
                    auto next = dynamic_cast<PositionalBase *>(child);
                    auto group = dynamic_cast<Group *>(child);
                    if (group)
                    {
                        next = group->GetNextPositional();
                    }
                    if (next && next->Ready())
                    {
                        return next;
                    }
                }
                return nullptr;
            }